

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TextureSpecCase::readPixels
          (TextureSpecCase *this,Surface *dst,int x,int y,int width,int height)

{
  PixelBufferAccess PStack_58;
  
  tcu::Surface::setSize(dst,width,height);
  tcu::Surface::getAccess(&PStack_58,dst);
  sglr::ContextWrapper::glReadPixels
            (&this->super_ContextWrapper,x,y,width,height,0x1908,0x1401,
             PStack_58.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

void TextureSpecCase::readPixels (tcu::Surface& dst, int x, int y, int width, int height)
{
	dst.setSize(width, height);
	glReadPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}